

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmAssignment(ExpressionContext *ctx,VmModule *module,ExprAssignment *node)

{
  int iVar1;
  TypeBase *pTVar2;
  bool bVar3;
  VmValue *pVVar4;
  VmInstruction *instInit;
  VmConstant *pVVar5;
  VmInstruction *value;
  TypeArray *typeArray;
  SynBase *pSVar6;
  uint srcOffset;
  VmInstruction *value_00;
  ulong uVar7;
  uint in_stack_ffffffffffffffa8;
  
  pTVar2 = node->lhs->type;
  if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xca7,
                  "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)")
    ;
  }
  if ((TypeBase *)pTVar2[1]._vptr_TypeBase != node->rhs->type) {
    __assert_fail("refType->subType == node->rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xca8,
                  "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)")
    ;
  }
  pVVar4 = CompileVm(ctx,module,node->lhs);
  instInit = (VmInstruction *)CompileVm(ctx,module,node->rhs);
  if (((instInit == (VmInstruction *)0x0) || ((instInit->super_VmValue).typeID != 2)) ||
     (instInit->cmd != VM_INST_ARRAY)) {
    anon_unknown.dwarf_22bf96::CreateStore
              (ctx,module,(node->super_ExprBase).source,node->rhs->type,pVVar4,(VmValue *)instInit,0
              );
  }
  else {
    typeArray = (TypeArray *)(node->super_ExprBase).type;
    if ((typeArray == (TypeArray *)0x0) || ((typeArray->super_TypeBase).typeID != 0x13)) {
      typeArray = (TypeArray *)0x0;
    }
    pTVar2 = typeArray->subType;
    bVar3 = IsGoodConstantArray(ctx,module,instInit);
    pSVar6 = (node->super_ExprBase).source;
    if (bVar3) {
      pVVar5 = GetConstantArrayValue(ctx,pSVar6,typeArray,instInit);
      anon_unknown.dwarf_22bf96::CreateStore
                (ctx,module,(node->super_ExprBase).source,&typeArray->super_TypeBase,pVVar4,
                 &pVVar5->super_VmValue,0);
      srcOffset = (uint)pVVar5;
    }
    else {
      pVVar5 = anon_unknown.dwarf_22bf96::CreateAlloca
                         (ctx,module,pSVar6,node->rhs->type,"array",true);
      if ((instInit->arguments).count != 0) {
        uVar7 = 0;
        do {
          value_00 = (VmInstruction *)(instInit->arguments).data[uVar7];
          if ((value_00 == (VmInstruction *)0x0) || ((value_00->super_VmValue).typeID != 2)) {
            pSVar6 = (node->super_ExprBase).source;
            iVar1 = (int)pTVar2->size;
LAB_00276ade:
            in_stack_ffffffffffffffa8 = iVar1 * (int)uVar7;
            anon_unknown.dwarf_22bf96::CreateStore
                      (ctx,module,pSVar6,pTVar2,&pVVar5->super_VmValue,&value_00->super_VmValue,
                       in_stack_ffffffffffffffa8);
          }
          else {
            value = value_00;
            if (value_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
              if ((value_00->arguments).count == 0) {
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                             );
              }
              value = (VmInstruction *)*(value_00->arguments).data;
            }
            if (value_00->parent != module->currentBlock) {
              pSVar6 = (node->super_ExprBase).source;
              iVar1 = (int)pTVar2->size;
              value_00 = value;
              goto LAB_00276ade;
            }
            module->currentBlock->insertPoint = value_00;
            in_stack_ffffffffffffffa8 = (int)pTVar2->size * (int)uVar7;
            anon_unknown.dwarf_22bf96::CreateStore
                      (ctx,module,(node->super_ExprBase).source,pTVar2,&pVVar5->super_VmValue,
                       &value->super_VmValue,in_stack_ffffffffffffffa8);
            module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (instInit->arguments).count);
      }
      srcOffset = (uint)(typeArray->super_TypeBase).size;
      anon_unknown.dwarf_22bf96::CreateMemCopy
                (module,(node->super_ExprBase).source,pVVar4,0,&pVVar5->super_VmValue,srcOffset,
                 in_stack_ffffffffffffffa8);
    }
    instInit = (VmInstruction *)
               anon_unknown.dwarf_22bf96::CreateLoad
                         (ctx,module,(node->super_ExprBase).source,node->rhs->type,pVVar4,srcOffset)
    ;
  }
  pVVar4 = anon_unknown.dwarf_22bf96::CheckType
                     (ctx,(ExprBase *)(node->super_ExprBase).type,&instInit->super_VmValue);
  return pVVar4;
}

Assistant:

VmValue* CompileVmAssignment(ExpressionContext &ctx, VmModule *module, ExprAssignment *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	(void)refType;
	assert(refType);
	assert(refType->subType == node->rhs->type);

	VmValue *address = CompileVm(ctx, module, node->lhs);

	VmValue *initializer = CompileVm(ctx, module, node->rhs);

	if(VmInstruction *instInit = getType<VmInstruction>(initializer))
	{
		// Array initializers are compiled to per-element assignments
		if(instInit->cmd == VM_INST_ARRAY)
		{
			TypeArray *typeArray = getType<TypeArray>(node->type);

			TypeBase *elementType = typeArray->subType;

			if(IsGoodConstantArray(ctx, module, instInit))
			{
				VmValue *constant = GetConstantArrayValue(ctx, node->source, typeArray, instInit);

				CreateStore(ctx, module, node->source, typeArray, address, constant, 0);

				VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

				return CheckType(ctx, node, copy);
			}

			VmConstant *tempAddress = CreateAlloca(ctx, module, node->source, node->rhs->type, "array", true);

			for(unsigned i = 0; i < instInit->arguments.size(); i++)
			{
				VmValue *element = instInit->arguments[i];

				VmInstruction *elementInst = getType<VmInstruction>(element);

				if(elementInst)
				{
					if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
						element = elementInst->arguments[0];

					if(elementInst->parent == module->currentBlock)
					{
						module->currentBlock->insertPoint = elementInst;

						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));

						module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
					}
					else
					{
						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
					}
				}
				else
				{
					CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
				}
			}

			CreateMemCopy(module, node->source, address, 0, tempAddress, 0, int(typeArray->size));

			VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

			return CheckType(ctx, node, copy);
		}
	}

	CreateStore(ctx, module, node->source, node->rhs->type, address, initializer, 0);

	return CheckType(ctx, node, initializer);
}